

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

String * kj::encodeCEscape(String *__return_storage_ptr__,ArrayPtr<const_unsigned_char> bytes)

{
  ArrayDisposer **this;
  size_t capacity;
  Array<char> local_130;
  int local_118;
  char local_111;
  StringPtr local_110;
  StringPtr local_100;
  StringPtr local_f0;
  StringPtr local_e0;
  StringPtr local_d0;
  StringPtr local_c0;
  StringPtr local_b0;
  StringPtr local_a0;
  StringPtr local_90;
  StringPtr local_80;
  byte local_69;
  byte *pbStack_68;
  byte b;
  uchar *__end1;
  byte *local_50;
  uchar *__begin1;
  ArrayPtr<const_unsigned_char> *__range1;
  Vector<char> escaped;
  ArrayPtr<const_unsigned_char> bytes_local;
  
  escaped.builder.disposer = (ArrayDisposer *)bytes.ptr;
  this = &escaped.builder.disposer;
  capacity = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)this);
  Vector<char>::Vector((Vector<char> *)&__range1,capacity);
  __begin1 = (uchar *)this;
  local_50 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)this);
  pbStack_68 = ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)__begin1);
  for (; local_50 != pbStack_68; local_50 = local_50 + 1) {
    local_69 = *local_50;
    switch(local_69) {
    case 7:
      StringPtr::StringPtr(&local_80,"\\a");
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range1,&local_80);
      break;
    case 8:
      StringPtr::StringPtr(&local_90,"\\b");
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range1,&local_90);
      break;
    case 9:
      StringPtr::StringPtr(&local_d0,"\\t");
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range1,&local_d0);
      break;
    case 10:
      StringPtr::StringPtr(&local_b0,"\\n");
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range1,&local_b0);
      break;
    case 0xb:
      StringPtr::StringPtr(&local_e0,"\\v");
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range1,&local_e0);
      break;
    case 0xc:
      StringPtr::StringPtr(&local_a0,"\\f");
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range1,&local_a0);
      break;
    case 0xd:
      StringPtr::StringPtr(&local_c0,"\\r");
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range1,&local_c0);
      break;
    default:
      if ((local_69 < 0x20) || (local_69 == 0x7f)) {
        local_111 = '\\';
        Vector<char>::add<char>((Vector<char> *)&__range1,&local_111);
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&__range1,"0123456789abcdef" + (local_69 >> 6));
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&__range1,"0123456789abcdef" + (local_69 >> 3 & 7));
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&__range1,"0123456789abcdef" + (local_69 & 7));
      }
      else {
        Vector<char>::add<unsigned_char&>((Vector<char> *)&__range1,&local_69);
      }
      break;
    case 0x22:
      StringPtr::StringPtr(&local_100,"\\\"");
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range1,&local_100);
      break;
    case 0x27:
      StringPtr::StringPtr(&local_f0,"\\\'");
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range1,&local_f0);
      break;
    case 0x5c:
      StringPtr::StringPtr(&local_110,"\\\\");
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range1,&local_110);
    }
  }
  local_118 = 0;
  Vector<char>::add<int>((Vector<char> *)&__range1,&local_118);
  Vector<char>::releaseAsArray(&local_130,(Vector<char> *)&__range1);
  String::String(__return_storage_ptr__,&local_130);
  Array<char>::~Array(&local_130);
  Vector<char>::~Vector((Vector<char> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

String encodeCEscape(ArrayPtr<const byte> bytes) {
  Vector<char> escaped(bytes.size());

  for (byte b: bytes) {
    switch (b) {
      case '\a': escaped.addAll(StringPtr("\\a")); break;
      case '\b': escaped.addAll(StringPtr("\\b")); break;
      case '\f': escaped.addAll(StringPtr("\\f")); break;
      case '\n': escaped.addAll(StringPtr("\\n")); break;
      case '\r': escaped.addAll(StringPtr("\\r")); break;
      case '\t': escaped.addAll(StringPtr("\\t")); break;
      case '\v': escaped.addAll(StringPtr("\\v")); break;
      case '\'': escaped.addAll(StringPtr("\\\'")); break;
      case '\"': escaped.addAll(StringPtr("\\\"")); break;
      case '\\': escaped.addAll(StringPtr("\\\\")); break;
      default:
        if (b < 0x20 || b == 0x7f) {
          // Use octal escape, not hex, because hex escapes technically have no length limit and
          // so can create ambiguity with subsequent characters.
          escaped.add('\\');
          escaped.add(HEX_DIGITS[b / 64]);
          escaped.add(HEX_DIGITS[(b / 8) % 8]);
          escaped.add(HEX_DIGITS[b % 8]);
        } else {
          escaped.add(b);
        }
        break;
    }
  }

  escaped.add(0);
  return String(escaped.releaseAsArray());
}